

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_img_decompress_header(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int numkeys;
  int tstatus;
  int inhdupos;
  int hdupos;
  int bitpix;
  int naxis;
  long naxes [6];
  char card [81];
  
  iVar3 = *status;
  if (0 < iVar3) {
    return iVar3;
  }
  if (iVar3 == -1) {
    *status = 0;
  }
  iVar2 = fits_is_compressed_image(infptr,status);
  if (iVar2 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_img_decompress)");
    *status = 0x19e;
    return 0x19e;
  }
  ffghdn(infptr,&inhdupos);
  ffghdn(outfptr,&hdupos);
  ffghsp(outfptr,&numkeys,(int *)0x0,status);
  tstatus = 0;
  iVar2 = ffgcrd(infptr,"ZSIMPLE",card,&tstatus);
  if ((iVar2 == 0) && (hdupos == 1)) {
    if (numkeys == 0) {
      bVar4 = true;
      iVar3 = 0;
    }
    else {
      ffgipr(outfptr,6,&bitpix,&naxis,naxes,status);
      if (naxis != 0) goto LAB_0018a286;
      bVar4 = inhdupos != 2;
      iVar3 = numkeys;
    }
    for (; 0 < iVar3; iVar3 = iVar3 + -1) {
      ffdrec(outfptr,iVar3,status);
    }
    iVar3 = 0;
LAB_0018a337:
    if (*status < 1) {
      iVar3 = imcomp_copy_comp2img(infptr,outfptr,iVar3,status);
      if (0 < iVar3) {
        ffpmsg("error copying header keywords from compressed image");
      }
      if (!bVar4) {
        ffmahd(infptr,1,(int *)0x0,status);
        ffrdef(outfptr,status);
        iVar3 = imcomp_copy_prime2img(infptr,outfptr,status);
        if (0 < iVar3) {
          ffpmsg("error copying primary keywords from compressed file");
        }
        ffmahd(infptr,2,(int *)0x0,status);
      }
      goto LAB_0018a348;
    }
  }
  else {
LAB_0018a286:
    tstatus = 0;
    iVar2 = ffgcrd(infptr,"ZTENSION",card,&tstatus);
    if ((iVar2 == 0) && (iVar3 != -1)) {
      if (numkeys == 0) {
        iVar3 = 0;
        ffcrim(outfptr,8,0,naxes,status);
        iVar2 = ffcrhd(outfptr,status);
        if (0 < iVar2) goto LAB_0018a33c;
      }
      else {
        ffcrhd(outfptr,status);
        iVar3 = 0;
      }
LAB_0018a307:
      bVar4 = true;
      goto LAB_0018a337;
    }
    pFVar1 = infptr->Fptr;
    iVar3 = ffcrim(outfptr,pFVar1->zbitpix,pFVar1->zndim,pFVar1->znaxis,status);
    if (iVar3 < 1) {
      iVar3 = 1;
      goto LAB_0018a307;
    }
  }
LAB_0018a33c:
  ffpmsg("error creating output decompressed image HDU");
LAB_0018a348:
  return *status;
}

Assistant:

int fits_img_decompress_header(fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine reads the header of the input tile compressed image and 
  converts it to that of a standard uncompress FITS image.
*/

{
    int writeprime = 0;
    int hdupos, inhdupos, numkeys;
    int nullprime = 0, copyprime = 0, norec = 0, tstatus;
    char card[FLEN_CARD];
    int ii, naxis, bitpix;
    long naxes[MAX_COMPRESS_DIM];

    if (*status > 0)
        return(*status);
    else if (*status == -1) {
        *status = 0;
	writeprime = 1;
    }

    if (!fits_is_compressed_image(infptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_img_decompress)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* get information about the state of the output file; does it already */
    /* contain any keywords and HDUs?  */
    fits_get_hdu_num(infptr, &inhdupos);  /* Get the current output HDU position */
    fits_get_hdu_num(outfptr, &hdupos);  /* Get the current output HDU position */
    fits_get_hdrspace(outfptr, &numkeys, 0, status);

    /* Was the input compressed HDU originally the primary array image? */
    tstatus = 0;
    if (!fits_read_card(infptr, "ZSIMPLE", card, &tstatus)) { 
      /* yes, input HDU was a primary array (not an IMAGE extension) */
      /* Now determine if we can uncompress it into the primary array of */
      /* the output file.  This is only possible if the output file */
      /* currently only contains a null primary array, with no addition */
      /* header keywords and with no following extension in the FITS file. */
      
      if (hdupos == 1) {  /* are we positioned at the primary array? */
            if (numkeys == 0) { /* primary HDU is completely empty */
	        nullprime = 1;
            } else {
                fits_get_img_param(outfptr, MAX_COMPRESS_DIM, &bitpix, &naxis, naxes, status);
	
	        if (naxis == 0) { /* is this a null image? */
                   nullprime = 1;

		   if (inhdupos == 2)  /* must be at the first extension */
		      copyprime = 1;
		}
           }
      }
    } 

    if (nullprime) {  
       /* We will delete the existing keywords in the null primary array
          and uncompress the input image into the primary array of the output.
	  Some of these keywords may be added back to the uncompressed image
	  header later.
       */

       for (ii = numkeys; ii > 0; ii--)
          fits_delete_record(outfptr, ii, status);

    } else  {

       /* if the ZTENSION keyword doesn't exist, then we have to 
          write the required keywords manually */
       tstatus = 0;
       if (fits_read_card(infptr, "ZTENSION", card, &tstatus)) {

          /* create an empty output image with the correct dimensions */
          if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
             (infptr->Fptr)->znaxis, status) > 0)
          {
             ffpmsg("error creating output decompressed image HDU");
    	     return (*status);
          }

	  norec = 1;  /* the required keywords have already been written */

       } else {  /* the input compressed image does have ZTENSION keyword */
       
          if (writeprime) {  /* convert the image extension to a primary array */
	      /* have to write the required keywords manually */

              /* create an empty output image with the correct dimensions */
              if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
                 (infptr->Fptr)->znaxis, status) > 0)
              {
                 ffpmsg("error creating output decompressed image HDU");
    	         return (*status);
              }

	      norec = 1;  /* the required keywords have already been written */

          } else {  /* write the input compressed image to an image extension */

              if (numkeys == 0) {  /* the output file is currently completely empty */
	  
	         /* In this case, the input is a compressed IMAGE extension. */
	         /* Since the uncompressed output file is currently completely empty, */
	         /* we need to write a null primary array before uncompressing the */
                 /* image extension */
	     
                 ffcrim(outfptr, 8, 0, naxes, status); /* naxes is not used */
	     
	         /* now create the empty extension to uncompress into */
                 if (fits_create_hdu(outfptr, status) > 0)
                 {
                      ffpmsg("error creating output decompressed image HDU");
    	              return (*status);
                 }
	  
	      } else {
                  /* just create a new empty extension, then copy all the required */
	          /* keywords into it.  */
                 fits_create_hdu(outfptr, status);
	      }
           }
       }

    }

    if (*status > 0)  {
        ffpmsg("error creating output decompressed image HDU");
    	return (*status);
    }

    /* Copy the table header to the image header. */

    if (imcomp_copy_comp2img(infptr, outfptr, norec, status) > 0)
    {
        ffpmsg("error copying header keywords from compressed image");
    }

    if (copyprime) {  
	/* append any unexpected keywords from the primary array.
	   This includes any keywords except SIMPLE, BITPIX, NAXIS,
	   EXTEND, COMMENT, HISTORY, CHECKSUM, and DATASUM.
	*/

        fits_movabs_hdu(infptr, 1, NULL, status);  /* move to primary array */
	
        /* do this so that any new keywords get written before any blank
	   keywords that may have been appended by imcomp_copy_comp2img  */
        fits_set_hdustruc(outfptr, status);

        if (imcomp_copy_prime2img(infptr, outfptr, status) > 0)
        {
            ffpmsg("error copying primary keywords from compressed file");
        }

        fits_movabs_hdu(infptr, 2, NULL, status); /* move back to where we were */
    }

    return (*status);
}